

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

bool __thiscall glslang::TParseContext::isRuntimeLength(TParseContext *this,TIntermTyped *base)

{
  bool bVar1;
  int iVar2;
  TOperator TVar3;
  int iVar4;
  undefined4 extraout_var;
  long lVar5;
  TIntermOperator *this_00;
  undefined4 extraout_var_01;
  TIntermConstantUnion *this_01;
  TConstUnionArray *this_02;
  TConstUnion *this_03;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TType *this_04;
  vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_> *this_05;
  size_type sVar6;
  int memberCount;
  int index;
  TIntermBinary *binary;
  TIntermTyped *base_local;
  TParseContext *this_local;
  undefined4 extraout_var_00;
  
  iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x1e])();
  lVar5 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x58))();
  if (((uint)*(undefined8 *)(lVar5 + 8) & 0x7f) == 6) {
    iVar2 = (*(base->super_TIntermNode)._vptr_TIntermNode[0x14])();
    this_00 = (TIntermOperator *)CONCAT44(extraout_var_00,iVar2);
    if ((this_00 != (TIntermOperator *)0x0) &&
       (TVar3 = TIntermOperator::getOp(this_00), TVar3 == EOpIndexDirectStruct)) {
      iVar2 = (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x33])();
      this_01 = (TIntermConstantUnion *)
                (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar2) + 0x28))();
      this_02 = TIntermConstantUnion::getConstArray(this_01);
      this_03 = TConstUnionArray::operator[](this_02,0);
      iVar2 = TConstUnion::getIConst(this_03);
      iVar4 = (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
      bVar1 = TIntermTyped::isReference((TIntermTyped *)CONCAT44(extraout_var_02,iVar4));
      if (bVar1) {
        return false;
      }
      iVar4 = (*(this_00->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x32])();
      this_04 = (TType *)(**(code **)(*(long *)CONCAT44(extraout_var_03,iVar4) + 0xf0))();
      this_05 = &TType::getStruct(this_04)->
                 super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>;
      sVar6 = std::vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>::size
                        (this_05);
      if (iVar2 == (int)sVar6 + -1) {
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool TParseContext::isRuntimeLength(const TIntermTyped& base) const
{
    if (base.getType().getQualifier().storage == EvqBuffer) {
        // in a buffer block
        const TIntermBinary* binary = base.getAsBinaryNode();
        if (binary != nullptr && binary->getOp() == EOpIndexDirectStruct) {
            // is it the last member?
            const int index = binary->getRight()->getAsConstantUnion()->getConstArray()[0].getIConst();

            if (binary->getLeft()->isReference())
                return false;

            const int memberCount = (int)binary->getLeft()->getType().getStruct()->size();
            if (index == memberCount - 1)
                return true;
        }
    }

    return false;
}